

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::ByteSizeLong
          (ItemSimilarityRecommender_SimilarItems *this)

{
  long lVar1;
  Rep *pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  void **ppvVar9;
  
  sVar8 = (size_t)(this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->similaritemlist_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (sVar8 != 0) {
    lVar1 = sVar8 * 8;
    lVar7 = 0;
    do {
      sVar5 = ItemSimilarityRecommender_ConnectedItem::ByteSizeLong
                        (*(ItemSimilarityRecommender_ConnectedItem **)((long)ppvVar9 + lVar7));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar1 - lVar7 != 0);
  }
  if (this->itemid_ != 0) {
    uVar6 = this->itemid_ | 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar5 = sVar8 + 9;
  if (this->itemscoreadjustment_ == 0.0) {
    sVar5 = sVar8;
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t ItemSimilarityRecommender_SimilarItems::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
  total_size += 1UL * this->_internal_similaritemlist_size();
  for (const auto& msg : this->similaritemlist_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // uint64 itemId = 1;
  if (this->_internal_itemid() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_itemid());
  }

  // double itemScoreAdjustment = 3;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_itemscoreadjustment = this->_internal_itemscoreadjustment();
  uint64_t raw_itemscoreadjustment;
  memcpy(&raw_itemscoreadjustment, &tmp_itemscoreadjustment, sizeof(tmp_itemscoreadjustment));
  if (raw_itemscoreadjustment != 0) {
    total_size += 1 + 8;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}